

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

timediff_t Curl_pp_state_timeout(Curl_easy *data,pingpong *pp,_Bool disconnecting)

{
  uint uVar1;
  connectdata *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  timediff_t tVar7;
  curltime cVar8;
  curltime cVar9;
  curltime newer;
  curltime newer_00;
  long local_80;
  ulong local_68;
  timediff_t timeout2_ms;
  timediff_t response_time;
  timediff_t timeout_ms;
  connectdata *conn;
  _Bool disconnecting_local;
  pingpong *pp_local;
  Curl_easy *data_local;
  
  pcVar2 = data->conn;
  if ((data->set).server_response_timeout == 0) {
    local_68 = pp->response_time;
  }
  else {
    local_68 = (ulong)(data->set).server_response_timeout;
  }
  cVar8 = Curl_now();
  uVar3 = (pp->response).tv_sec;
  uVar4 = (pp->response).tv_usec;
  cVar9.tv_usec = uVar4;
  cVar9.tv_sec = uVar3;
  cVar9._12_4_ = 0;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar8._0_12_,0);
  newer.tv_usec = SUB124(cVar8._0_12_,8);
  tVar7 = Curl_timediff(newer,cVar9);
  response_time = local_68 - tVar7;
  if (((data->set).timeout != 0) && (!disconnecting)) {
    uVar1 = (data->set).timeout;
    cVar9 = Curl_now();
    uVar5 = (pcVar2->now).tv_sec;
    uVar6 = (pcVar2->now).tv_usec;
    cVar8.tv_usec = uVar6;
    cVar8.tv_sec = uVar5;
    cVar8._12_4_ = 0;
    newer_00._12_4_ = 0;
    newer_00.tv_sec = SUB128(cVar9._0_12_,0);
    newer_00.tv_usec = SUB124(cVar9._0_12_,8);
    tVar7 = Curl_timediff(newer_00,cVar8);
    local_80 = (ulong)uVar1 - tVar7;
    if (response_time < local_80) {
      local_80 = response_time;
    }
    response_time = local_80;
  }
  return response_time;
}

Assistant:

timediff_t Curl_pp_state_timeout(struct Curl_easy *data,
                                 struct pingpong *pp, bool disconnecting)
{
  struct connectdata *conn = data->conn;
  timediff_t timeout_ms; /* in milliseconds */
  timediff_t response_time = (data->set.server_response_timeout)?
    data->set.server_response_timeout: pp->response_time;

  /* if CURLOPT_SERVER_RESPONSE_TIMEOUT is set, use that to determine
     remaining time, or use pp->response because SERVER_RESPONSE_TIMEOUT is
     supposed to govern the response for any given server response, not for
     the time from connect to the given server response. */

  /* Without a requested timeout, we only wait 'response_time' seconds for the
     full response to arrive before we bail out */
  timeout_ms = response_time -
    Curl_timediff(Curl_now(), pp->response); /* spent time */

  if(data->set.timeout && !disconnecting) {
    /* if timeout is requested, find out how much remaining time we have */
    timediff_t timeout2_ms = data->set.timeout - /* timeout time */
      Curl_timediff(Curl_now(), conn->now); /* spent time */

    /* pick the lowest number */
    timeout_ms = CURLMIN(timeout_ms, timeout2_ms);
  }

  return timeout_ms;
}